

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

unsigned_long * __thiscall
pbrt::
HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
::operator[](HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
             *this,LightHandle *key)

{
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar1;
  size_t sVar2;
  
  sVar2 = FindOffset(this,key);
  poVar1 = (this->table).ptr;
  if (poVar1[sVar2].set != false) {
    return (unsigned_long *)((long)&poVar1[sVar2].optionalValue + 8);
  }
  LogFatal<char_const(&)[26]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/containers.h"
             ,0x292,"Check failed: %s",(char (*) [26])"table[offset].has_value()");
}

Assistant:

PBRT_CPU_GPU
    const Value &operator[](const Key &key) const {
        size_t offset = FindOffset(key);
        CHECK(table[offset].has_value());
        return table[offset]->second;
    }